

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_connecthost(connectdata *conn,Curl_dns_entry *remotehost)

{
  int iVar1;
  curltime cVar2;
  timediff_t local_50;
  timediff_t timeout_ms;
  undefined1 auStack_38 [4];
  CURLcode result;
  curltime before;
  Curl_easy *data;
  Curl_dns_entry *remotehost_local;
  connectdata *conn_local;
  
  before._8_8_ = conn->data;
  cVar2 = Curl_now();
  _auStack_38 = cVar2.tv_sec;
  before.tv_sec._0_4_ = cVar2.tv_usec;
  timeout_ms._4_4_ = CURLE_COULDNT_CONNECT;
  local_50 = Curl_timeleft((Curl_easy *)before._8_8_,(curltime *)auStack_38,true);
  if (local_50 < 0) {
    Curl_failf((Curl_easy *)before._8_8_,"Connection time-out");
    conn_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    iVar1 = Curl_num_addresses(remotehost->addr);
    conn->num_addr = iVar1;
    conn->tempaddr[0] = remotehost->addr;
    conn->tempaddr[1] = (Curl_addrinfo *)0x0;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    if (conn->tempaddr[0]->ai_next != (Curl_addrinfo *)0x0) {
      local_50 = local_50 / 2;
    }
    conn->timeoutms_per_addr = local_50;
    while ((conn->tempaddr[0] != (Curl_addrinfo *)0x0 &&
           (timeout_ms._4_4_ = singleipconnect(conn,conn->tempaddr[0],conn->tempsock),
           timeout_ms._4_4_ != CURLE_OK))) {
      conn->tempaddr[0] = conn->tempaddr[0]->ai_next;
    }
    if (conn->tempsock[0] == -1) {
      if (timeout_ms._4_4_ == CURLE_OK) {
        timeout_ms._4_4_ = CURLE_COULDNT_CONNECT;
      }
      conn_local._4_4_ = timeout_ms._4_4_;
    }
    else {
      *(long *)(before._8_8_ + 0x1620) = *(long *)(before._8_8_ + 0x1620) + 1;
      Curl_expire(conn->data,*(time_t *)(before._8_8_ + 0x7b8),EXPIRE_HAPPY_EYEBALLS);
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_connecthost(struct connectdata *conn,  /* context */
                          const struct Curl_dns_entry *remotehost)
{
  struct Curl_easy *data = conn->data;
  struct curltime before = Curl_now();
  CURLcode result = CURLE_COULDNT_CONNECT;

  timediff_t timeout_ms = Curl_timeleft(data, &before, TRUE);

  if(timeout_ms < 0) {
    /* a precaution, no need to continue if time already is up */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  conn->num_addr = Curl_num_addresses(remotehost->addr);
  conn->tempaddr[0] = remotehost->addr;
  conn->tempaddr[1] = NULL;
  conn->tempsock[0] = CURL_SOCKET_BAD;
  conn->tempsock[1] = CURL_SOCKET_BAD;

  /* Max time for the next connection attempt */
  conn->timeoutms_per_addr =
    conn->tempaddr[0]->ai_next == NULL ? timeout_ms : timeout_ms / 2;

  /* start connecting to first IP */
  while(conn->tempaddr[0]) {
    result = singleipconnect(conn, conn->tempaddr[0], &(conn->tempsock[0]));
    if(!result)
      break;
    conn->tempaddr[0] = conn->tempaddr[0]->ai_next;
  }

  if(conn->tempsock[0] == CURL_SOCKET_BAD) {
    if(!result)
      result = CURLE_COULDNT_CONNECT;
    return result;
  }

  data->info.numconnects++; /* to track the number of connections made */
  Curl_expire(conn->data, data->set.happy_eyeballs_timeout,
              EXPIRE_HAPPY_EYEBALLS);

  return CURLE_OK;
}